

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsigc++.h
# Opt level: O0

void __thiscall
sigc::signal<void,_int,_void_*>::emit(signal<void,_int,_void_*> *this,int params,void *params_1)

{
  bool bVar1;
  reference this_00;
  functor_base<void,_int,_void_*> *pfVar2;
  EVP_PKEY_CTX *ctx;
  pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int> *it;
  iterator __end0;
  iterator __begin0;
  small_vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_16UL,_void,_void>
  *__range2;
  void *params_local_1;
  int params_local;
  signal<void,_int,_void_*> *this_local;
  
  boost::container::
  vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
  ::begin((vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
           *)&__end0);
  boost::container::
  vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
  ::end((vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
         *)&it);
  while( true ) {
    ctx = (EVP_PKEY_CTX *)&it;
    bVar1 = boost::container::operator!=
                      (&__end0,(vec_iterator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>_*,_false>
                                *)ctx);
    if (!bVar1) break;
    this_00 = boost::container::
              vec_iterator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>_*,_false>
              ::operator*(&__end0);
    bVar1 = boost::intrusive_ptr::operator_cast_to_bool((intrusive_ptr *)this_00);
    if (bVar1) {
      pfVar2 = boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>::operator->
                         (&this_00->first);
      (*(pfVar2->super_functor_refcnt)._vptr_functor_refcnt[2])(pfVar2,(ulong)(uint)params,params_1)
      ;
    }
    boost::container::
    vec_iterator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>_*,_false>
    ::operator++(&__end0);
  }
  cleanup(this,ctx);
  return;
}

Assistant:

void emit(PARAM_TYPES... params) {
        for (auto &it : m_funcs) {
            if (it.first) {
                it.first->operator()(params...);
            }
        }

        cleanup();
    }